

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int diff_nims_list(nifti_image *s0,nifti_image *s1,str_list *slist,int display)

{
  char **ppcVar1;
  int iVar2;
  field_s *fieldp;
  long lVar3;
  int iVar4;
  
  ppcVar1 = slist->list;
  iVar4 = 0;
  for (lVar3 = 0; (int)lVar3 < slist->len; lVar3 = lVar3 + 1) {
    fieldp = get_nim_field(ppcVar1[lVar3],1);
    if (fieldp != (field_s *)0x0) {
      iVar2 = diff_field(fieldp,s0,s1,1);
      if (iVar2 != 0) {
        if (display != 0) {
          disp_field((char *)0x0,fieldp,s0,1,(uint)(iVar4 == 0));
          disp_field((char *)0x0,fieldp,s1,1,0);
        }
        iVar4 = iVar4 + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int diff_nims_list( nifti_image * s0, nifti_image * s1, str_list * slist,
                    int display )
{
   field_s  * fp;
   char    ** sptr;
   int        c, ndiff = 0;

   sptr = slist->list;
   for( c = 0; c < slist->len; c++ )
   {
      fp = get_nim_field(*sptr, 1);    /* "not found" displayed in func */
      if( fp && diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }
      sptr++;
   }

   return ndiff;
}